

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O2

void do_equipment(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  OBJ_DATA *pOVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  char *pcVar3;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  OBJ_DATA **ppOVar4;
  long lVar5;
  string_view fmt;
  format_args args_00;
  string buffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  
  send_to_char("You are using:\n\r",ch);
  lVar5 = 0;
  bVar1 = false;
  do {
    ppOVar4 = &ch->carrying;
    if (lVar5 == 0x10) {
      while (pOVar2 = *ppOVar4, pOVar2 != (OBJ_DATA *)0x0) {
        if (pOVar2->wear_loc == 0x15) {
          local_58._M_dataplus._M_p = pOVar2->wear_loc_name;
          if (local_58._M_dataplus._M_p == (char *)0x0) {
            local_58._M_dataplus._M_p = "bug: unset wear_loc on cosmetic";
          }
          args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xc;
          fmt.size_ = 0xc;
          fmt.data_ = (char *)0x3;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&local_58;
          ::fmt::v9::vformat_abi_cxx11_(&buffer,(v9 *)"{}>",fmt,args_00);
          ::fmt::v9::sprintf<char[12],std::__cxx11::string,char>
                    (&local_58,(v9 *)"<worn %-14s",(char (*) [12])&buffer,args);
          std::__cxx11::string::operator=((string *)&buffer,(string *)&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          send_to_char(buffer._M_dataplus._M_p,ch);
          bVar1 = can_see_obj(ch,pOVar2);
          pcVar3 = "something.";
          if (bVar1) {
            format_obj_to_char(pOVar2,ch,true);
            pcVar3 = format_obj_to_char::buf;
          }
          send_to_char(pcVar3,ch);
          send_to_char("\n\r",ch);
          std::__cxx11::string::~string((string *)&buffer);
          bVar1 = true;
        }
        ppOVar4 = &pOVar2->next_content;
      }
    }
    else if (lVar5 == 0x16) {
      if (!bVar1) {
        send_to_char("Nothing.\n\r",ch);
      }
      return;
    }
    pOVar2 = get_eq_char(ch,(int)lVar5);
    if (pOVar2 != (OBJ_DATA *)0x0 && lVar5 != 0x15) {
      send_to_char(where_name[lVar5],ch);
      bVar1 = can_see_obj(ch,pOVar2);
      pcVar3 = "something.";
      if (bVar1) {
        format_obj_to_char(pOVar2,ch,true);
        pcVar3 = format_obj_to_char::buf;
      }
      send_to_char(pcVar3,ch);
      send_to_char("\n\r",ch);
      bVar1 = true;
    }
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void do_equipment(CHAR_DATA *ch, char *argument)
{
	send_to_char("You are using:\n\r", ch);

	auto found = false;
	for (auto iWear = 0; iWear < MAX_WEAR; iWear++)
	{
		if (iWear == WEAR_WIELD) // cosmetics come right before "wield" on display
		{
			for (auto tObj = ch->carrying; tObj; tObj = tObj->next_content)
			{
				if (tObj->wear_loc == WEAR_COSMETIC)
				{
					auto buffer = fmt::format("{}>", tObj->wear_loc_name ? tObj->wear_loc_name : "bug: unset wear_loc on cosmetic");
					buffer = fmt::sprintf("<worn %-14s", buffer);
					send_to_char(buffer.c_str(), ch);

					if (can_see_obj(ch, tObj))
						send_to_char(format_obj_to_char(tObj, ch, true), ch);
					else
						send_to_char("something.", ch);

					send_to_char("\n\r", ch);
					found = true;
				}
			}
		}

		auto obj = get_eq_char(ch, iWear);
		if (iWear == WEAR_COSMETIC || obj == nullptr)
			continue;

		send_to_char(where_name[iWear], ch);

		if (can_see_obj(ch, obj))
			send_to_char(format_obj_to_char(obj, ch, true), ch);
		else
			send_to_char("something.", ch);

		send_to_char("\n\r", ch);
		found = true;
	}

	if (!found)
		send_to_char("Nothing.\n\r", ch);
}